

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilDsd.c
# Opt level: O0

Sdm_Man_t * Sdm_ManRead(void)

{
  if (s_SdmMan == (Sdm_Man_t *)0x0) {
    s_SdmMan = Sdm_ManAlloc();
  }
  memset(s_SdmMan->nCountDsd,0,0x94c);
  return s_SdmMan;
}

Assistant:

Sdm_Man_t * Sdm_ManRead()
{
    if ( s_SdmMan == NULL )
        s_SdmMan = Sdm_ManAlloc();
    memset( s_SdmMan->nCountDsd, 0, sizeof(int) * DSD_CLASS_NUM );
    return s_SdmMan;
}